

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O1

void __thiscall
efsw::FileWatcherInotify::checkForNewWatcher(FileWatcherInotify *this,Watcher *watch,string *fpath)

{
  _Rb_tree_header *p_Var1;
  Mutex *this_00;
  _Base_ptr p_Var2;
  _Base_ptr __n;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  WatcherInotify *iWatch;
  
  FileSystem::dirAddSlashAtEnd(fpath);
  if ((watch->Recursive == true) && (bVar3 = FileSystem::isDirectory(fpath), bVar3)) {
    this_00 = &this->mWatchesLock;
    Mutex::lock(this_00);
    p_Var5 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      p_Var2 = (_Base_ptr)fpath->_M_string_length;
      do {
        __n = (p_Var5[1]._M_parent)->_M_right;
        if ((__n == p_Var2) &&
           ((__n == (_Base_ptr)0x0 ||
            (iVar4 = bcmp((p_Var5[1]._M_parent)->_M_left,(fpath->_M_dataplus)._M_p,(size_t)__n),
            iVar4 == 0)))) {
          Mutex::unlock(this_00);
          return;
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    Mutex::unlock(this_00);
    addWatch(this,fpath,watch->Listener,watch->Recursive,
             (bool)watch[1].OldFileName.field_2._M_local_buf[8],(WatcherInotify *)watch,true);
  }
  return;
}

Assistant:

void FileWatcherInotify::checkForNewWatcher( Watcher* watch, std::string fpath ) {
	FileSystem::dirAddSlashAtEnd( fpath );

	/// If the watcher is recursive, checks if the new file is a folder, and creates a watcher
	if ( watch->Recursive && FileSystem::isDirectory( fpath ) ) {
		bool found = false;

		{
			Lock lock( mWatchesLock );

			/// First check if exists
			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); ++it ) {
				if ( it->second->Directory == fpath ) {
					found = true;
					break;
				}
			}
		}

		if ( !found ) {
			WatcherInotify* iWatch = static_cast<WatcherInotify*>( watch );
			addWatch( fpath, watch->Listener, watch->Recursive, iWatch->syntheticEvents,
					  static_cast<WatcherInotify*>( watch ), true );
		}
	}
}